

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O2

int MRIStepSetOrder(void *arkode_mem,int ord)

{
  int iVar1;
  int iVar2;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Tliw;
  sunindextype Tlrw;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepSetOrder",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    iVar2 = 3;
    if (0xfffffffd < ord - 5U) {
      iVar2 = ord;
    }
    step_mem->q = iVar2;
    step_mem->p = 0;
    step_mem->stages = 0;
    MRIStepCoupling_Space(step_mem->MRIC,&Tliw,&Tlrw);
    MRIStepCoupling_Free(step_mem->MRIC);
    step_mem->MRIC = (MRIStepCoupling)0x0;
    ark_mem->liw = ark_mem->liw - (long)Tliw;
    ark_mem->lrw = ark_mem->lrw - (long)Tlrw;
  }
  return iVar1;
}

Assistant:

int MRIStepSetOrder(void *arkode_mem, int ord)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  sunindextype Tlrw, Tliw;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepSetOrder",
                                 &ark_mem, &step_mem);
  if (retval) return(retval);

  /* check for illegal inputs */
  if (ord < 3 || ord > 4) {
    step_mem->q = 3;
  } else {
    step_mem->q = ord;
  }

  /* Clear tables, the user is requesting a change in method or a reset to
     defaults. Tables will be set in InitialSetup. */
  step_mem->stages = 0;
  step_mem->p = 0;
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  MRIStepCoupling_Free(step_mem->MRIC);
  step_mem->MRIC = NULL;
  ark_mem->liw -= Tliw;
  ark_mem->lrw -= Tlrw;

  return(ARK_SUCCESS);
}